

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureMemoryRegistry.cpp
# Opt level: O3

void __thiscall SecureMemoryRegistry::wipe(SecureMemoryRegistry *this)

{
  _Rb_tree_node_base *p_Var1;
  _Self __tmp;
  MutexLocker lock;
  MutexLocker local_38;
  
  MutexLocker::MutexLocker(&local_38,this->SecMemRegistryMutex);
  for (p_Var1 = (this->registry)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->registry)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    softHSMLog(7,"wipe",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/SecureMemoryRegistry.cpp"
               ,0x76,"Wiping block of %d bytes at 0x%x",p_Var1[1]._M_parent,
               *(undefined8 *)(p_Var1 + 1));
    memset(*(void **)(p_Var1 + 1),0,(size_t)p_Var1[1]._M_parent);
  }
  MutexLocker::~MutexLocker(&local_38);
  return;
}

Assistant:

void SecureMemoryRegistry::wipe()
{
	MutexLocker lock(SecMemRegistryMutex);

	// Be very careful in this method to catch any weird exceptions that
	// may occur since if we're in this method it means something has already
	// gone pear shaped once before and we're exiting on a fatal exception
	try
	{
		for (std::map<void*, size_t>::iterator i = registry.begin(); i != registry.end(); i++)
		{
			try
			{
				DEBUG_MSG("Wiping block of %d bytes at 0x%x", i->second, i->first);
			}
			catch (...)
			{
			}
	
			try
			{
	#ifdef PARANOID
				memset(i->first, 0xFF, i->second);
	#endif // PARANOID
				memset(i->first, 0x00, i->second);
			}
			catch (...)
			{
				ERROR_MSG("Failed to wipe block of %d bytes at 0x%x", i->second, i->first);
			}
		}
	}
	catch (...)
	{
		ERROR_MSG("Failed to enumerate the secure memory registry");
	}
}